

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O3

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::AddEntry
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,char *a_pValue,char *a_pComment,bool a_bForceReplace,bool a_bCopyStrings)

{
  char *pLeft;
  bool bVar1;
  SI_Error SVar2;
  iterator iVar3;
  iterator iVar4;
  uint uVar5;
  _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
  *this_00;
  undefined3 in_register_00000089;
  int iVar6;
  byte bVar7;
  undefined4 uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pair<std::_Rb_tree_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_bool>
  pVar11;
  value_type oEntry;
  _Base_ptr local_e0;
  char *local_d8;
  char *local_d0;
  uint local_c8;
  undefined4 local_c4;
  _Base_ptr local_c0;
  _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
  *local_b8;
  undefined1 local_b0 [24];
  _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
  local_98;
  _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
  local_68;
  
  local_e0 = (_Base_ptr)a_pComment;
  local_d8 = a_pKey;
  local_d0 = a_pSection;
  local_c0 = (_Base_ptr)a_pValue;
  if ((a_pComment == (char *)0x0 || !a_bCopyStrings) ||
     (SVar2 = CopyString(this,(char **)&local_e0), SI_FAIL < SVar2)) {
    local_b0._8_8_ = (char *)0x0;
    local_b0._16_4_ = 0;
    local_b0._0_8_ = a_pSection;
    iVar3 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,(key_type *)local_b0);
    if ((_Rb_tree_header *)iVar3._M_node == &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      if ((a_bCopyStrings) &&
         (SVar2 = CopyString(this,&local_d0), a_pSection = local_d0, SVar2 < SI_OK)) {
        return SVar2;
      }
      local_b0._16_4_ = this->m_nOrder + 1;
      this->m_nOrder = local_b0._16_4_;
      local_b0._8_8_ = local_e0;
      if (a_pValue != (char *)0x0) {
        local_b0._8_8_ = (_Base_ptr)0x0;
      }
      if (a_pKey == (char *)0x0) {
        local_b0._8_8_ = local_e0;
      }
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl._0_8_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_98._M_impl.super__Rb_tree_header._M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_b0._0_8_ = a_pSection;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right =
           local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
      ::~_Rb_tree(&local_68);
      pVar11 = std::
               _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
               ::
               _M_emplace_unique<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>&>
                         ((_Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,std::multimap<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,char_const*,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>>>>
                           *)&this->m_data,
                          (pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>
                           *)local_b0);
      iVar3._M_node = (_Base_ptr)pVar11.first._M_node;
      std::
      _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
      ::~_Rb_tree(&local_98);
      uVar5 = (uint)CONCAT71((int7)((ulong)a_pSection >> 8),1);
    }
    else {
      uVar5 = 0;
    }
    if (a_pKey != (char *)0x0 && a_pValue != (char *)0x0) {
      this_00 = (_Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
                 *)&iVar3._M_node[1]._M_right;
      local_b0._8_8_ = (char *)0x0;
      local_b0._16_4_ = 0;
      local_b0._0_8_ = a_pKey;
      iVar4 = std::
              _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
              ::find((_Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                      *)this_00,(key_type *)local_b0);
      pLeft = local_d8;
      iVar6 = this->m_nOrder + 1;
      this->m_nOrder = iVar6;
      p_Var10 = iVar3._M_node + 2;
      bVar7 = this->m_bAllowMultiKey;
      uVar8 = CONCAT31(in_register_00000089,a_bForceReplace);
      if ((bVar7 & a_bForceReplace & iVar4._M_node != p_Var10) == 1) {
        p_Var9 = (_Base_ptr)0x0;
        local_c8 = uVar5;
        local_c4 = CONCAT31(in_register_00000089,a_bForceReplace);
        local_b8 = this_00;
        do {
          bVar1 = SI_GenericNoCase<char>::operator()
                            ((SI_GenericNoCase<char> *)
                             &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                              IsLess(char_const*,char_const*)::isLess,pLeft,
                             *(char **)(iVar4._M_node + 1));
          if (bVar1) break;
          if (*(int *)&iVar4._M_node[1]._M_left < iVar6) {
            p_Var9 = iVar4._M_node[1]._M_parent;
            iVar6 = *(int *)&iVar4._M_node[1]._M_left;
          }
          iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node);
        } while (iVar4._M_node != p_Var10);
        if (p_Var9 != (_Base_ptr)0x0) {
          DeleteString(this,(char *)local_e0);
          local_e0 = p_Var9;
          CopyString(this,(char **)&local_e0);
        }
        Delete(this,local_d0,pLeft,false);
        bVar7 = this->m_bAllowMultiKey;
        this_00 = local_b8;
        iVar4._M_node = p_Var10;
        uVar8 = local_c4;
        uVar5 = local_c8;
      }
      bVar7 = ((byte)uVar8 ^ 1) & bVar7;
      if (a_bCopyStrings) {
        if (((iVar4._M_node != p_Var10 & (bVar7 ^ 1)) == 0) &&
           (SVar2 = CopyString(this,&local_d8), SVar2 < SI_OK)) {
          return SVar2;
        }
        SVar2 = CopyString(this,(char **)&local_c0);
        if (SVar2 < SI_OK) {
          return SVar2;
        }
      }
      if (iVar4._M_node == p_Var10 || (bVar7 & 1) != 0) {
        local_b0._0_8_ = local_d8;
        local_b0._8_8_ = local_e0;
        local_98._M_impl._0_8_ = (char *)0x0;
        local_b0._16_4_ = iVar6;
        iVar4 = std::
                _Rb_tree<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry,std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>,std::_Select1st<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>,CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry::KeyOrder,std::allocator<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>>>
                ::
                _M_emplace_equal<std::pair<CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::Entry_const,char_const*>&>
                          (this_00,(pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>
                                    *)local_b0);
        uVar5 = 1;
      }
      iVar4._M_node[1]._M_right = local_c0;
    }
    SVar2 = (uVar5 & 0xff) + SI_UPDATED;
  }
  return SVar2;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::AddEntry(const SI_CHAR *a_pSection, const SI_CHAR *a_pKey,
																	  const SI_CHAR *a_pValue,
																	  const SI_CHAR *a_pComment, bool a_bForceReplace,
																	  bool a_bCopyStrings) {
	SI_Error rc;
	bool bInserted = false;

	SI_ASSERT(!a_pComment || IsComment(*a_pComment));

	// if we are copying strings then make a copy of the comment now
	// because we will need it when we add the entry.
	if (a_bCopyStrings && a_pComment) {
		rc = CopyString(a_pComment);
		if (rc < 0) return rc;
	}

	// create the section entry if necessary
	typename TSection::iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		// if the section doesn't exist then we need a copy as the
		// string needs to last beyond the end of this function
		if (a_bCopyStrings) {
			rc = CopyString(a_pSection);
			if (rc < 0) return rc;
		}

		// only set the comment if this is a section only entry
		Entry oSection(a_pSection, ++m_nOrder);
		if (a_pComment && (!a_pKey || !a_pValue)) {
			oSection.pComment = a_pComment;
		}

		typename TSection::value_type oEntry(oSection, TKeyVal());
		typedef typename TSection::iterator SectionIterator;
		std::pair<SectionIterator, bool> i = m_data.insert(oEntry);
		iSection = i.first;
		bInserted = true;
	}
	if (!a_pKey || !a_pValue) {
		// section only entries are specified with pItem and pVal as NULL
		return bInserted ? SI_INSERTED : SI_UPDATED;
	}

	// check for existence of the key
	TKeyVal &keyval = iSection->second;
	typename TKeyVal::iterator iKey = keyval.find(a_pKey);

	// remove all existing entries but save the load order and
	// comment of the first entry
	int nLoadOrder = ++m_nOrder;
	if (iKey != keyval.end() && m_bAllowMultiKey && a_bForceReplace) {
		const SI_CHAR *pComment = NULL;
		while (iKey != keyval.end() && !IsLess(a_pKey, iKey->first.pItem)) {
			if (iKey->first.nOrder < nLoadOrder) {
				nLoadOrder = iKey->first.nOrder;
				pComment = iKey->first.pComment;
			}
			++iKey;
		}
		if (pComment) {
			DeleteString(a_pComment);
			a_pComment = pComment;
			(void)CopyString(a_pComment);
		}
		Delete(a_pSection, a_pKey);
		iKey = keyval.end();
	}

	// make string copies if necessary
	bool bForceCreateNewKey = m_bAllowMultiKey && !a_bForceReplace;
	if (a_bCopyStrings) {
		if (bForceCreateNewKey || iKey == keyval.end()) {
			// if the key doesn't exist then we need a copy as the
			// string needs to last beyond the end of this function
			// because we will be inserting the key next
			rc = CopyString(a_pKey);
			if (rc < 0) return rc;
		}

		// we always need a copy of the value
		rc = CopyString(a_pValue);
		if (rc < 0) return rc;
	}

	// create the key entry
	if (iKey == keyval.end() || bForceCreateNewKey) {
		Entry oKey(a_pKey, nLoadOrder);
		if (a_pComment) {
			oKey.pComment = a_pComment;
		}
		typename TKeyVal::value_type oEntry(oKey, static_cast<const SI_CHAR *>(NULL));
		iKey = keyval.insert(oEntry);
		bInserted = true;
	}
	iKey->second = a_pValue;
	return bInserted ? SI_INSERTED : SI_UPDATED;
}